

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,field_number * 8);
  WriteSInt32NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}